

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

bool __thiscall libcellml::Model::hasImports(Model *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  byte local_69;
  enable_shared_from_this<libcellml::Model> local_60;
  shared_ptr<const_libcellml::ComponentEntity> local_50 [2];
  undefined1 local_30 [8];
  UnitsPtr units;
  size_t index;
  bool importsPresent;
  Model *this_local;
  
  index._7_1_ = false;
  units.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  while( true ) {
    _Var1._M_pi = units.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi;
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)unitsCount(this);
    local_69 = 0;
    if (_Var1._M_pi < p_Var2) {
      local_69 = index._7_1_ ^ 0xff;
    }
    if ((local_69 & 1) == 0) break;
    Model::units((Model *)local_30,(size_t)this);
    index._7_1_ = hasUnitsImports((UnitsPtr *)local_30);
    std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_30);
    units.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ((long)&(units.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi)->_vptr__Sp_counted_base + 1);
  }
  if (index._7_1_ == false) {
    std::enable_shared_from_this<libcellml::Model>::shared_from_this(&local_60);
    std::shared_ptr<libcellml::ComponentEntity_const>::shared_ptr<libcellml::Model_const,void>
              ((shared_ptr<libcellml::ComponentEntity_const> *)local_50,
               (shared_ptr<const_libcellml::Model> *)&local_60);
    index._7_1_ = hasComponentImports((ComponentEntityConstPtr *)local_50);
    std::shared_ptr<const_libcellml::ComponentEntity>::~shared_ptr(local_50);
    std::shared_ptr<const_libcellml::Model>::~shared_ptr
              ((shared_ptr<const_libcellml::Model> *)&local_60);
  }
  return index._7_1_;
}

Assistant:

bool Model::hasImports() const
{
    bool importsPresent = false;
    for (size_t index = 0; (index < unitsCount()) && !importsPresent; ++index) {
        libcellml::UnitsPtr units = Model::units(index);
        importsPresent = hasUnitsImports(units);
    }

    if (!importsPresent) {
        importsPresent = hasComponentImports(shared_from_this());
    }

    return importsPresent;
}